

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O2

int __thiscall Fl_Help_View::get_length(Fl_Help_View *this,char *l)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  
  if (*l == '\0') {
    iVar1 = 0;
  }
  else {
    iVar1 = atoi(l);
    sVar2 = strlen(l);
    if (l[sVar2 - 1] == '%') {
      iVar3 = 0;
      if (0 < iVar1) {
        iVar3 = iVar1;
      }
      if (99 < iVar3) {
        iVar3 = 100;
      }
      iVar1 = this->scrollbar_size_;
      if (iVar1 == 0) {
        iVar1 = Fl::scrollbar_size();
      }
      iVar1 = ((this->hsize_ - iVar1) * iVar3) / 100;
    }
  }
  return iVar1;
}

Assistant:

int
Fl_Help_View::get_length(const char *l) {	// I - Value
  int	val;					// Integer value

  if (!l[0]) return 0;

  val = atoi(l);
  if (l[strlen(l) - 1] == '%') {
    if (val > 100) val = 100;
    else if (val < 0) val = 0;

    int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
    val = val * (hsize_ - scrollsize) / 100;
  }

  return val;
}